

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kinematic_chain.c
# Opt level: O1

void kca_fpk(kca_joint *joint,ga_pose *x)

{
  if (joint == (kca_joint *)0x0) {
    __assert_fail("joint",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/rosym-project[P]dyn2b/src/dyn2b/kinematic_chain.c"
                  ,0xc,"void kca_fpk(const struct kca_joint *, struct ga_pose *)");
  }
  if (x != (ga_pose *)0x0) {
    x->target_body = joint->target_body;
    x->reference_body = joint->reference_body;
    x->target_frame = joint->target_frame;
    x->reference_frame = joint->reference_frame;
    return;
  }
  __assert_fail("x",
                "/workspace/llm4binary/github/license_all_cmakelists_25/rosym-project[P]dyn2b/src/dyn2b/kinematic_chain.c"
                ,0xd,"void kca_fpk(const struct kca_joint *, struct ga_pose *)");
}

Assistant:

void kca_fpk(
        const struct kca_joint *joint,
        struct ga_pose *x)
{
    assert(joint);
    assert(x);

    x->target_body = joint->target_body;
    x->reference_body = joint->reference_body;
    x->target_frame = joint->target_frame;
    x->reference_frame = joint->reference_frame;
}